

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

bool __thiscall zmq::ctx_t::start(ctx_t *this)

{
  vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *this_00;
  pointer *pppiVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  iterator __position_00;
  pointer ppiVar4;
  empty_slots_t *this_01;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  reaper_t *prVar8;
  mailbox_t *pmVar9;
  io_thread_t *piVar10;
  int *piVar11;
  size_type __n;
  ulong uVar12;
  uint uVar13;
  io_thread_t *io_thread;
  io_thread_t *local_50;
  vector<zmq::io_thread_t*,std::allocator<zmq::io_thread_t*>> *local_48;
  empty_slots_t *local_40;
  ulong local_38;
  
  uVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (uVar7 != 0) {
    start((ctx_t *)(ulong)uVar7);
  }
  iVar2 = this->_max_sockets;
  iVar3 = this->_io_thread_count;
  uVar7 = pthread_mutex_unlock((pthread_mutex_t *)this);
  if (uVar7 != 0) {
    start((ctx_t *)(ulong)uVar7);
  }
  __n = (long)iVar3 + (long)iVar2 + 2;
  this_00 = &this->_slots;
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::reserve(this_00,__n);
  local_40 = &this->_empty_slots;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_40,(long)(iVar2 + iVar3));
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::resize(this_00,2);
  *(this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl.
   super__Vector_impl_data._M_start = &(this->_term_mailbox).super_i_mailbox;
  prVar8 = (reaper_t *)operator_new(0xf0,(nothrow_t *)&std::nothrow);
  if (prVar8 == (reaper_t *)0x0) {
    prVar8 = (reaper_t *)0x0;
  }
  else {
    reaper_t::reaper_t(prVar8,this,1);
  }
  this->_reaper = prVar8;
  if (prVar8 == (reaper_t *)0x0) {
    piVar11 = __errno_location();
    *piVar11 = 0xc;
  }
  else {
    pmVar9 = reaper_t::get_mailbox(prVar8);
    bVar5 = mailbox_t::valid(pmVar9);
    if (bVar5) {
      pmVar9 = reaper_t::get_mailbox(this->_reaper);
      (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl
      .super__Vector_impl_data._M_start[1] = &pmVar9->super_i_mailbox;
      reaper_t::start(this->_reaper);
      local_50 = (io_thread_t *)0x0;
      std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::resize
                (this_00,__n,(value_type *)&local_50);
      uVar7 = iVar3 + 2;
      bVar5 = iVar3 == 0;
      if (!bVar5) {
        local_48 = (vector<zmq::io_thread_t*,std::allocator<zmq::io_thread_t*>> *)&this->_io_threads
        ;
        local_38 = (ulong)uVar7;
        uVar12 = 2;
        do {
          piVar10 = (io_thread_t *)operator_new(0xe0,(nothrow_t *)&std::nothrow);
          if (piVar10 == (io_thread_t *)0x0) {
            piVar10 = (io_thread_t *)0x0;
          }
          else {
            io_thread_t::io_thread_t(piVar10,this,(uint32_t)uVar12);
          }
          local_50 = piVar10;
          if (piVar10 == (io_thread_t *)0x0) {
            piVar11 = __errno_location();
            *piVar11 = 0xc;
LAB_001772bd:
            if (!bVar5) goto LAB_00177327;
            break;
          }
          pmVar9 = io_thread_t::get_mailbox(piVar10);
          bVar6 = mailbox_t::valid(pmVar9);
          piVar10 = local_50;
          if (!bVar6) {
            if (local_50 != (io_thread_t *)0x0) {
              io_thread_t::~io_thread_t(local_50);
              operator_delete(piVar10,0xe0);
            }
            goto LAB_001772bd;
          }
          __position._M_current =
               (this->_io_threads).
               super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->_io_threads).
              super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<zmq::io_thread_t*,std::allocator<zmq::io_thread_t*>>::
            _M_realloc_insert<zmq::io_thread_t*const&>(local_48,__position,&local_50);
          }
          else {
            *__position._M_current = local_50;
            pppiVar1 = &(this->_io_threads).
                        super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppiVar1 = *pppiVar1 + 1;
          }
          pmVar9 = io_thread_t::get_mailbox(local_50);
          (this_00->super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>)._M_impl
          .super__Vector_impl_data._M_start[uVar12] = &pmVar9->super_i_mailbox;
          io_thread_t::start(local_50);
          uVar12 = uVar12 + 1;
          bVar5 = local_38 == uVar12;
        } while (!bVar5);
      }
      this_01 = local_40;
      uVar12 = (ulong)((long)(this->_slots).
                             super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_slots).
                            super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3;
      if ((int)uVar7 < (int)uVar12) {
        do {
          uVar13 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar13;
          local_50 = (io_thread_t *)CONCAT44(local_50._4_4_,uVar13);
          __position_00._M_current =
               (this->_empty_slots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (this->_empty_slots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(this_01,__position_00,(uint *)&local_50);
          }
          else {
            *__position_00._M_current = uVar13;
            (this->_empty_slots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        } while ((int)uVar7 < (int)uVar13);
      }
      this->_starting = false;
      return true;
    }
LAB_00177327:
    reaper_t::stop(this->_reaper);
    prVar8 = this->_reaper;
    if (prVar8 != (reaper_t *)0x0) {
      reaper_t::~reaper_t(prVar8);
      operator_delete(prVar8,0xf0);
    }
    this->_reaper = (reaper_t *)0x0;
  }
  ppiVar4 = (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppiVar4) {
    (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar4;
  }
  return false;
}

Assistant:

bool zmq::ctx_t::start ()
{
    //  Initialise the array of mailboxes. Additional two slots are for
    //  zmq_ctx_term thread and reaper thread.
    _opt_sync.lock ();
    const int term_and_reaper_threads_count = 2;
    const int mazmq = _max_sockets;
    const int ios = _io_thread_count;
    _opt_sync.unlock ();
    const int slot_count = mazmq + ios + term_and_reaper_threads_count;
    try {
        _slots.reserve (slot_count);
        _empty_slots.reserve (slot_count - term_and_reaper_threads_count);
    }
    catch (const std::bad_alloc &) {
        errno = ENOMEM;
        return false;
    }
    _slots.resize (term_and_reaper_threads_count);

    //  Initialise the infrastructure for zmq_ctx_term thread.
    _slots[term_tid] = &_term_mailbox;

    //  Create the reaper thread.
    _reaper = new (std::nothrow) reaper_t (this, reaper_tid);
    if (!_reaper) {
        errno = ENOMEM;
        goto fail_cleanup_slots;
    }
    if (!_reaper->get_mailbox ()->valid ())
        goto fail_cleanup_reaper;
    _slots[reaper_tid] = _reaper->get_mailbox ();
    _reaper->start ();

    //  Create I/O thread objects and launch them.
    _slots.resize (slot_count, NULL);

    for (int i = term_and_reaper_threads_count;
         i != ios + term_and_reaper_threads_count; i++) {
        io_thread_t *io_thread = new (std::nothrow) io_thread_t (this, i);
        if (!io_thread) {
            errno = ENOMEM;
            goto fail_cleanup_reaper;
        }
        if (!io_thread->get_mailbox ()->valid ()) {
            delete io_thread;
            goto fail_cleanup_reaper;
        }
        _io_threads.push_back (io_thread);
        _slots[i] = io_thread->get_mailbox ();
        io_thread->start ();
    }

    //  In the unused part of the slot array, create a list of empty slots.
    for (int32_t i = static_cast<int32_t> (_slots.size ()) - 1;
         i >= static_cast<int32_t> (ios) + term_and_reaper_threads_count; i--) {
        _empty_slots.push_back (i);
    }

    _starting = false;
    return true;

fail_cleanup_reaper:
    _reaper->stop ();
    delete _reaper;
    _reaper = NULL;

fail_cleanup_slots:
    _slots.clear ();
    return false;
}